

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreInstPrinter.c
# Opt level: O1

void XCore_insn_extract(MCInst *MI,char *code)

{
  anon_union_1480_8_3a70395c_for_cs_detail_6 *paVar1;
  uint8_t *puVar2;
  cs_opt_value cVar3;
  cs_detail *pcVar4;
  xcore_reg xVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  char tmp [128];
  char acStack_98 [128];
  
  strcpy(acStack_98,code);
  pcVar7 = strchr(acStack_98,0x20);
  if (pcVar7 == (char *)0x0) {
    return;
  }
  pcVar7 = pcVar7 + 1;
  pcVar8 = strchr(pcVar7,0x2c);
  if (pcVar8 != (char *)0x0) {
    *pcVar8 = '\0';
    xVar5 = XCore_reg_id(pcVar7);
    if ((xVar5 != XCORE_REG_INVALID) && (MI->csh->detail != CS_OPT_OFF)) {
      pcVar4 = MI->flat_insn->detail;
      puVar2 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.prefix[0] * 0x10 + 0x12;
      puVar2[0] = '\x01';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      pcVar4 = MI->flat_insn->detail;
      *(xcore_reg *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.prefix[0] * 0x10 + 0x16) = xVar5;
      paVar1 = &MI->flat_insn->detail->field_6;
      (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + '\x01';
    }
    pcVar8 = pcVar8 + 1;
    do {
      pcVar7 = pcVar8;
      pcVar8 = pcVar7 + 1;
    } while (*pcVar7 == ' ');
    if (*pcVar7 == '\0') {
      return;
    }
    for (; pcVar8[-1] != '\0'; pcVar8 = pcVar8 + 1) {
      if (pcVar8[-1] == '[') {
        pcVar8[-1] = '\0';
        xVar5 = XCore_reg_id(pcVar7);
        if (xVar5 == XCORE_REG_INVALID) {
          return;
        }
        pcVar7 = pcVar8;
        if (MI->csh->detail != CS_OPT_OFF) {
          pcVar4 = MI->flat_insn->detail;
          puVar2 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.prefix[0] * 0x10 + 0x12;
          puVar2[0] = '\x03';
          puVar2[1] = '\0';
          puVar2[2] = '\0';
          puVar2[3] = '\0';
          pcVar4 = MI->flat_insn->detail;
          pcVar4->groups[(ulong)(pcVar4->field_6).x86.prefix[0] * 0x10 + 0x16] = (uint8_t)xVar5;
          pcVar4 = MI->flat_insn->detail;
          pcVar4->groups[(ulong)(pcVar4->field_6).x86.prefix[0] * 0x10 + 0x17] = '\0';
          pcVar4 = MI->flat_insn->detail;
          puVar2 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.prefix[0] * 0x10 + 0x1a;
          puVar2[0] = '\0';
          puVar2[1] = '\0';
          puVar2[2] = '\0';
          puVar2[3] = '\0';
          pcVar4 = MI->flat_insn->detail;
          puVar2 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.prefix[0] * 0x10 + 0x1e;
          puVar2[0] = '\x01';
          puVar2[1] = '\0';
          puVar2[2] = '\0';
          puVar2[3] = '\0';
        }
        goto LAB_001c7978;
      }
    }
  }
  xVar5 = XCore_reg_id(pcVar7);
  if (xVar5 == XCORE_REG_INVALID) {
    return;
  }
  if (MI->csh->detail == CS_OPT_OFF) {
    return;
  }
  pcVar4 = MI->flat_insn->detail;
  puVar2 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.prefix[0] * 0x10 + 0x12;
  puVar2[0] = '\x01';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
  pcVar4 = MI->flat_insn->detail;
  *(xcore_reg *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.prefix[0] * 0x10 + 0x16) = xVar5;
code_r0x001c79f3:
  paVar1 = &MI->flat_insn->detail->field_6;
  (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + '\x01';
  return;
LAB_001c7978:
  if (*pcVar7 == '\0') goto LAB_001c79e6;
  if (*pcVar7 == ']') {
    *pcVar7 = '\0';
    xVar5 = XCore_reg_id(pcVar8);
    cVar3 = MI->csh->detail;
    if (xVar5 == XCORE_REG_INVALID) {
      if (cVar3 != CS_OPT_OFF) {
        iVar6 = atoi(pcVar8);
        pcVar4 = MI->flat_insn->detail;
        *(int *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.prefix[0] * 0x10 + 0x1a) = iVar6;
      }
    }
    else if (cVar3 != CS_OPT_OFF) {
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.prefix[0] * 0x10 + 0x17] = (uint8_t)xVar5;
    }
    goto LAB_001c79e6;
  }
  pcVar7 = pcVar7 + 1;
  goto LAB_001c7978;
LAB_001c79e6:
  if (MI->csh->detail == CS_OPT_OFF) {
    return;
  }
  goto code_r0x001c79f3;
}

Assistant:

void XCore_insn_extract(MCInst *MI, const char *code)
{
	int id;
	char *p, *p2;
	char tmp[128];

// make MSVC shut up on strcpy()
#ifdef _MSC_VER
#pragma warning(push)
#pragma warning(disable : 4996)
#endif
	strcpy(tmp, code); // safe because code is way shorter than 128 bytes
#ifdef _MSC_VER
#pragma warning(pop)
#endif

	// find the first space
	p = strchr(tmp, ' ');
	if (p) {
		p++;
		// find the next ','
		p2 = strchr(p, ',');
		if (p2) {
			*p2 = '\0';
			id = XCore_reg_id(p);
			if (id) {
				// register
				if (MI->csh->detail) {
					MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].type = XCORE_OP_REG;
					MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].reg = id;
					MI->flat_insn->detail->xcore.op_count++;
				}
			}
			// next should be register, or memory?
			// skip space
			p2++;
			while(*p2 && *p2 == ' ')
				p2++;
			if (*p2) {
				// find '['
				p = p2;
				while(*p && *p != '[')
					p++;
				if (*p) {
					// this is '['
					*p = '\0';
					id = XCore_reg_id(p2);
					if (id) {
						// base register
						if (MI->csh->detail) {
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].type = XCORE_OP_MEM;
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.base = id;
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.index = XCORE_REG_INVALID;
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.disp = 0;
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.direct = 1;
						}

						p++;
						p2 = p;
						// until ']'
						while(*p && *p != ']')
							p++;
						if (*p) {
							*p = '\0';
							// p2 is either index, or disp
							id = XCore_reg_id(p2);
							if (id) {
								// index register
								if (MI->csh->detail) {
									MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.index = id;
								}
							} else {
								// a number means disp
								if (MI->csh->detail) {
									MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.disp = atoi(p2);
								}
							}
						}

						if (MI->csh->detail) {
							MI->flat_insn->detail->xcore.op_count++;
						}
					}
				} else {
					// a register?
					id = XCore_reg_id(p2);
					if (id) {
						// register
						if (MI->csh->detail) {
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].type = XCORE_OP_REG;
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].reg = id;
							MI->flat_insn->detail->xcore.op_count++;
						}
					}
				}
			}
		} else {
			id = XCore_reg_id(p);
			if (id) {
				// register
				if (MI->csh->detail) {
					MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].type = XCORE_OP_REG;
					MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].reg = id;
					MI->flat_insn->detail->xcore.op_count++;
				}
			}
		}
	}
}